

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_function_queue.h
# Opt level: O1

optional<int> __thiscall
density::
conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
::try_consume_impl(conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *this,conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
                         *param_2)

{
  int iVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_int_()> *pFVar2;
  void *pvVar3;
  consume_operation cons;
  consume_operation local_40;
  
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
  ::try_start_consume(&local_40,param_2);
  if (local_40.m_consume_operation.m_control == (ControlBlock *)0x0) {
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__align = 0;
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__size[4] = '\0';
  }
  else {
    pFVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::complete_type(&local_40.m_consume_operation);
    pvVar3 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
             ::consume_operation::unaligned_element_ptr(&local_40.m_consume_operation);
    iVar1 = (*pFVar2->m_align_invoke_destroy)(pvVar3);
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
    ::consume_operation::commit_nodestroy(&local_40);
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__size[4] = '\x01';
    (this->m_queue).m_mutex.super___mutex_base._M_mutex.__data.__lock = iVar1;
  }
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation(&local_40);
  return (optional<int>)this;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }